

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlevdur.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *this;
  char *pcVar5;
  size_type __n;
  bool bVar6;
  allocator local_475;
  int num_order;
  string local_470;
  vector<double,_std::allocator<double>_> autocorrelation;
  ReverseLevinsonDurbinRecursion reverse_levinson_durbin_recursion;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  Buffer buffer;
  ostringstream error_message_3;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_order = 0x19;
  while (iVar3 = ya_getopt_long(argc,argv,"m:h",(option *)0x0,(int *)0x0), iVar3 == 0x6d) {
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_3);
    bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
    bVar6 = num_order < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar1 || bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::__cxx11::string::string((string *)&error_message_3,"rlevdur",(allocator *)&buffer);
      sptk::PrintErrorMessage((string *)&error_message_3,(ostringstream *)&ifs);
LAB_00102820:
      std::__cxx11::string::~string((string *)&error_message_3);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      return 1;
    }
  }
  if (iVar3 != -1) {
    if (iVar3 != 0x68) {
      anon_unknown.dwarf_2bb6::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    anon_unknown.dwarf_2bb6::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&error_message_3,"rlevdur",(allocator *)&buffer);
    sptk::PrintErrorMessage((string *)&error_message_3,(ostringstream *)&ifs);
    goto LAB_00102820;
  }
  if (argc == ya_optind) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = argv[ya_optind];
  }
  bVar1 = sptk::SetBinaryMode();
  this = (ostringstream *)&ifs;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&error_message_3,"rlevdur",(allocator *)&buffer);
    sptk::PrintErrorMessage((string *)&error_message_3,(ostringstream *)&ifs);
    goto LAB_00102820;
  }
  std::ifstream::ifstream(this);
  if ((pcVar5 == (char *)0x0) ||
     (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
     (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      this = (ostringstream *)&std::cin;
    }
    sptk::ReverseLevinsonDurbinRecursion::ReverseLevinsonDurbinRecursion
              (&reverse_levinson_durbin_recursion,num_order);
    sptk::ReverseLevinsonDurbinRecursion::Buffer::Buffer(&buffer);
    if (reverse_levinson_durbin_recursion.is_valid_ == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
      std::operator<<((ostream *)&error_message_3,
                      "Failed to initialize ReverseLevinsonDurbinRecursion");
      std::__cxx11::string::string((string *)&local_470,"rlevdur",(allocator *)&autocorrelation);
      sptk::PrintErrorMessage(&local_470,&error_message_3);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_3);
      iVar3 = 1;
    }
    else {
      __n = (long)num_order + 1;
      std::vector<double,_std::allocator<double>_>::vector
                (&autocorrelation,__n,(allocator_type *)&error_message_3);
      std::vector<double,_std::allocator<double>_>::vector
                (&linear_predictive_coefficients,__n,(allocator_type *)&error_message_3);
      do {
        bVar1 = sptk::ReadStream<double>
                          (false,0,0,(int)__n,&linear_predictive_coefficients,(istream *)this,
                           (int *)0x0);
        if (!bVar1) {
          iVar3 = 0;
          goto LAB_00102a41;
        }
        bVar1 = sptk::ReverseLevinsonDurbinRecursion::Run
                          (&reverse_levinson_durbin_recursion,&linear_predictive_coefficients,
                           &autocorrelation,&buffer);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
          std::operator<<((ostream *)&error_message_3,
                          "Failed to solve autocorrelation normal equations");
          std::__cxx11::string::string((string *)&local_470,"rlevdur",&local_475);
          sptk::PrintErrorMessage(&local_470,&error_message_3);
          goto LAB_00102a27;
        }
        bVar1 = sptk::WriteStream<double>
                          (0,(int)__n,&autocorrelation,(ostream *)&std::cout,(int *)0x0);
      } while (bVar1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
      std::operator<<((ostream *)&error_message_3,"Failed to write autocorrelation");
      std::__cxx11::string::string((string *)&local_470,"rlevdur",&local_475);
      sptk::PrintErrorMessage(&local_470,&error_message_3);
LAB_00102a27:
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_3);
      iVar3 = 1;
LAB_00102a41:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&linear_predictive_coefficients.super__Vector_base<double,_std::allocator<double>_>
                );
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&autocorrelation.super__Vector_base<double,_std::allocator<double>_>);
    }
    sptk::ReverseLevinsonDurbinRecursion::Buffer::~Buffer(&buffer);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
    poVar4 = std::operator<<((ostream *)&error_message_3,"Cannot open file ");
    std::operator<<(poVar4,pcVar5);
    std::__cxx11::string::string((string *)&buffer,"rlevdur",(allocator *)&local_470);
    sptk::PrintErrorMessage((string *)&buffer,&error_message_3);
    std::__cxx11::string::~string((string *)&buffer);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_3);
    iVar3 = 1;
  }
  std::ifstream::~ifstream(&ifs);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("rlevdur", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("rlevdur", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("rlevdur", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("rlevdur", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::ReverseLevinsonDurbinRecursion reverse_levinson_durbin_recursion(
      num_order);
  sptk::ReverseLevinsonDurbinRecursion::Buffer buffer;
  if (!reverse_levinson_durbin_recursion.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize ReverseLevinsonDurbinRecursion";
    sptk::PrintErrorMessage("rlevdur", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> autocorrelation(length);
  std::vector<double> linear_predictive_coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &linear_predictive_coefficients,
                          &input_stream, NULL)) {
    if (!reverse_levinson_durbin_recursion.Run(linear_predictive_coefficients,
                                               &autocorrelation, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to solve autocorrelation normal equations";
      sptk::PrintErrorMessage("rlevdur", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, autocorrelation, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write autocorrelation";
      sptk::PrintErrorMessage("rlevdur", error_message);
      return 1;
    }
  }

  return 0;
}